

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

void __thiscall cfd::core::ScriptOperator::ScriptOperator(ScriptOperator *this,ScriptType data_type)

{
  allocator local_39;
  string local_38;
  ScriptType local_14;
  ScriptOperator *pSStack_10;
  ScriptType data_type_local;
  ScriptOperator *this_local;
  
  local_14 = data_type;
  pSStack_10 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_38,"",&local_39);
  ScriptOperator(this,data_type,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

ScriptOperator::ScriptOperator(ScriptType data_type)
    : ScriptOperator(data_type, "") {
  // do nothing
}